

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void display_player_stat_info(void)

{
  char local_68 [8];
  char buf [80];
  wchar_t col;
  wchar_t row;
  wchar_t i;
  
  buf[0x4c] = '*';
  buf[0x4d] = '\0';
  buf[0x4e] = '\0';
  buf[0x4f] = '\0';
  c_put_str('\x01',"  Self",L'\x01',L'/');
  c_put_str('\x01'," RB",L'\x01',buf._76_4_ + L'\f');
  c_put_str('\x01'," CB",L'\x01',buf._76_4_ + L'\x10');
  c_put_str('\x01'," EB",L'\x01',buf._76_4_ + L'\x14');
  c_put_str('\x01',"  Best",L'\x01',buf._76_4_ + L'\x18');
  for (col = L'\0'; col < L'\x05'; col = col + L'\x01') {
    if (player->stat_cur[col] < player->stat_max[col]) {
      put_str(stat_names_reduced[col],col + L'\x02',buf._76_4_);
    }
    else {
      put_str(stat_names[col],col + L'\x02',buf._76_4_);
    }
    if (player->stat_max[col] == 0x76) {
      put_str("!",col + L'\x02',buf._76_4_ + L'\x03');
    }
    cnv_stat((int)player->stat_max[col],local_68,0x50);
    c_put_str('\r',local_68,col + L'\x02',buf._76_4_ + L'\x05');
    strnfmt(local_68,0x50,"%+3d",(ulong)(uint)player->race->r_adj[col]);
    c_put_str('\x0e',local_68,col + L'\x02',buf._76_4_ + L'\f');
    strnfmt(local_68,0x50,"%+3d",(ulong)(uint)player->class->c_adj[col]);
    c_put_str('\x0e',local_68,col + L'\x02',buf._76_4_ + L'\x10');
    strnfmt(local_68,0x50,"%+3d",(ulong)(uint)(player->state).stat_add[col]);
    c_put_str('\x0e',local_68,col + L'\x02',buf._76_4_ + L'\x14');
    cnv_stat((player->state).stat_top[col],local_68,0x50);
    c_put_str('\r',local_68,col + L'\x02',buf._76_4_ + L'\x18');
    if (player->stat_cur[col] < player->stat_max[col]) {
      cnv_stat((player->state).stat_use[col],local_68,0x50);
      c_put_str('\v',local_68,col + L'\x02',buf._76_4_ + L'\x1f');
    }
  }
  return;
}

Assistant:

void display_player_stat_info(void)
{
	int i, row, col;

	char buf[80];


	/* Row */
	row = 2;

	/* Column */
	col = 42;

	/* Print out the labels for the columns */
	c_put_str(COLOUR_WHITE, "  Self", row-1, col+5);
	c_put_str(COLOUR_WHITE, " RB", row-1, col+12);
	c_put_str(COLOUR_WHITE, " CB", row-1, col+16);
	c_put_str(COLOUR_WHITE, " EB", row-1, col+20);
	c_put_str(COLOUR_WHITE, "  Best", row-1, col+24);

	/* Display the stats */
	for (i = 0; i < STAT_MAX; i++) {
		/* Reduced or normal */
		if (player->stat_cur[i] < player->stat_max[i])
			/* Use lowercase stat name */
			put_str(stat_names_reduced[i], row+i, col);
		else
			/* Assume uppercase stat name */
			put_str(stat_names[i], row+i, col);

		/* Indicate natural maximum */
		if (player->stat_max[i] == 18+100)
			put_str("!", row+i, col+3);

		/* Internal "natural" maximum value */
		cnv_stat(player->stat_max[i], buf, sizeof(buf));
		c_put_str(COLOUR_L_GREEN, buf, row+i, col+5);

		/* Race Bonus */
		strnfmt(buf, sizeof(buf), "%+3d", player->race->r_adj[i]);
		c_put_str(COLOUR_L_BLUE, buf, row+i, col+12);

		/* Class Bonus */
		strnfmt(buf, sizeof(buf), "%+3d", player->class->c_adj[i]);
		c_put_str(COLOUR_L_BLUE, buf, row+i, col+16);

		/* Equipment Bonus */
		strnfmt(buf, sizeof(buf), "%+3d", player->state.stat_add[i]);
		c_put_str(COLOUR_L_BLUE, buf, row+i, col+20);

		/* Resulting "modified" maximum value */
		cnv_stat(player->state.stat_top[i], buf, sizeof(buf));
		c_put_str(COLOUR_L_GREEN, buf, row+i, col+24);

		/* Only display stat_use if there has been draining */
		if (player->stat_cur[i] < player->stat_max[i]) {
			cnv_stat(player->state.stat_use[i], buf, sizeof(buf));
			c_put_str(COLOUR_YELLOW, buf, row+i, col+31);
		}
	}
}